

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location,bool has_test_p)

{
  bool bVar1;
  anon_class_72_2_4f66548f_for_factory_ *this;
  byte in_DL;
  string full_name;
  string message;
  char kMissingTestCase [348];
  char kMissingInstantiation [378];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ignored;
  CodeLocation *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  string local_450 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  string local_408 [32];
  string local_3e8 [48];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [4];
  int in_stack_fffffffffffffcac;
  char *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  char *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  char *in_stack_fffffffffffffcd0;
  anon_class_72_2_4f66548f_for_factory_ *in_stack_fffffffffffffce0;
  undefined1 local_318 [352];
  undefined1 local_1b8 [392];
  _Self local_30;
  _Self local_28;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = GetIgnoredParameterizedTestSuites_abi_cxx11_();
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb78,(key_type *)0xb371b9);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb78);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    memcpy(local_1b8,
           " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
           ,0x17a);
    memcpy(local_318,
           " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are defined via TEST_P . No test cases will run.\n\nIdeally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from code that always depend on code that provides TEST_P. Failing to do so is often an indication of dead code, e.g. the last TEST_P was removed but the rest got left behind."
           ,0x15c);
    std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
    std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
    std::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string(local_378);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_3b8);
    std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
    std::__cxx11::string::~string(local_408);
    this = (anon_class_72_2_4f66548f_for_factory_ *)std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::string(local_450,(string *)&stack0xfffffffffffffcc8);
    CodeLocation::CodeLocation((CodeLocation *)this,in_stack_fffffffffffffb78);
    RegisterTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_third_party_googletest_src_googletest_src_gtest_cc:529:45)>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
               in_stack_fffffffffffffce0);
    InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation,bool)::$_0::
    ~__0(this);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffcc8);
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string& name, CodeLocation location,
                             bool has_test_p) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  const char kMissingInstantiation[] =  //
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  const char kMissingTestCase[] =  //
      " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are "
      "defined via TEST_P . No test cases will run."
      "\n\n"
      "Ideally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from "
      "code that always depend on code that provides TEST_P. Failing to do "
      "so is often an indication of dead code, e.g. the last TEST_P was "
      "removed but the rest got left behind.";

  std::string message =
      "Parameterized test suite " + name +
      (has_test_p ? kMissingInstantiation : kMissingTestCase) +
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
      name + ");";

  std::string full_name = "UninstantiatedParameterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}